

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticencoder.cpp
# Opt level: O2

void __thiscall ArithmeticEncoder::writeByte(ArithmeticEncoder *this,U8 sym)

{
  U32 *pUVar1;
  uint uVar2;
  uint uVar3;
  undefined3 in_register_00000031;
  
  uVar3 = this->length >> 8;
  this->length = uVar3;
  uVar3 = uVar3 * CONCAT31(in_register_00000031,sym);
  pUVar1 = &this->base;
  uVar2 = *pUVar1;
  *pUVar1 = *pUVar1 + uVar3;
  if (CARRY4(uVar2,uVar3)) {
    propagate_carry(this);
    if (0xffffff < this->length) {
      return;
    }
  }
  renorm_enc_interval(this);
  return;
}

Assistant:

void ArithmeticEncoder::writeByte(U8 sym)
{
  U32 init_base = base;
  base += (U32)(sym) * (length >>= 8);           // new interval base and length

  if (init_base > base) propagate_carry();                 // overflow = carry
  if (length < AC__MinLength) renorm_enc_interval();        // renormalization
}